

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_3x3_pack4.h
# Opt level: O1

void ncnn::pooling3x3s2_max_pack4_sse(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  long lVar9;
  undefined1 (*pauVar10) [16];
  int iVar11;
  long lVar12;
  long lVar13;
  undefined1 (*pauVar14) [16];
  int iVar15;
  long lVar16;
  long lVar17;
  undefined1 (*pauVar18) [16];
  undefined1 (*pauVar19) [16];
  
  iVar2 = bottom_blob->c;
  if (0 < (long)iVar2) {
    uVar3 = top_blob->w;
    iVar4 = top_blob->h;
    lVar12 = (long)(int)((bottom_blob->w - uVar3) * 8);
    lVar13 = 0;
    do {
      if (0 < iVar4) {
        pauVar14 = (undefined1 (*) [16])
                   (bottom_blob->cstep * lVar13 * bottom_blob->elemsize + (long)bottom_blob->data);
        lVar17 = (long)bottom_blob->w * bottom_blob->elemsize;
        pauVar19 = (undefined1 (*) [16])(*pauVar14 + lVar17 * 2);
        pauVar18 = (undefined1 (*) [16])(*pauVar14 + lVar17);
        pauVar10 = (undefined1 (*) [16])
                   (top_blob->cstep * lVar13 * top_blob->elemsize + (long)top_blob->data);
        iVar11 = 0;
        do {
          if ((int)uVar3 < 2) {
            uVar8 = 0;
          }
          else {
            iVar15 = 1;
            do {
              auVar1 = pauVar19[2];
              auVar5 = vmaxps_avx(*pauVar14,pauVar14[1]);
              auVar5 = vmaxps_avx(auVar5,pauVar14[2]);
              auVar5 = vmaxps_avx(auVar5,*pauVar18);
              auVar5 = vmaxps_avx(auVar5,pauVar18[1]);
              auVar6 = vmaxps_avx(pauVar18[2],*pauVar19);
              auVar6 = vmaxps_avx(auVar6,pauVar19[1]);
              auVar6 = vmaxps_avx(auVar6,auVar1);
              auVar7 = vmaxps_avx(pauVar14[3],pauVar14[4]);
              auVar5 = vmaxps_avx(auVar5,auVar6);
              auVar6 = vmaxps_avx(auVar7,pauVar14[2]);
              auVar6 = vmaxps_avx(auVar6,pauVar18[3]);
              auVar6 = vmaxps_avx(auVar6,pauVar18[4]);
              auVar7 = vmaxps_avx(pauVar18[2],pauVar19[3]);
              pauVar18 = pauVar18 + 4;
              auVar6 = vmaxps_avx(auVar6,pauVar19[4]);
              pauVar19 = pauVar19 + 4;
              pauVar14 = pauVar14 + 4;
              *pauVar10 = auVar5;
              auVar1 = vmaxps_avx(auVar1,auVar7);
              auVar1 = vmaxps_avx(auVar6,auVar1);
              pauVar10[1] = auVar1;
              pauVar10 = pauVar10 + 2;
              iVar15 = iVar15 + 2;
              uVar8 = uVar3 & 0xfffffffe;
            } while (iVar15 < (int)uVar3);
          }
          iVar15 = uVar3 - uVar8;
          if (iVar15 != 0 && (int)uVar8 <= (int)uVar3) {
            lVar16 = 0;
            lVar17 = 0;
            do {
              lVar9 = lVar17;
              auVar1 = vmaxps_avx(*(undefined1 (*) [16])(*pauVar14 + lVar9 * 2),
                                  *(undefined1 (*) [16])(pauVar14[1] + lVar9 * 2));
              auVar1 = vmaxps_avx(auVar1,*(undefined1 (*) [16])(pauVar14[2] + lVar9 * 2));
              auVar1 = vmaxps_avx(auVar1,*(undefined1 (*) [16])(*pauVar18 + lVar9 * 2));
              auVar1 = vmaxps_avx(auVar1,*(undefined1 (*) [16])(pauVar18[1] + lVar9 * 2));
              auVar5 = vmaxps_avx(*(undefined1 (*) [16])(pauVar18[2] + lVar9 * 2),
                                  *(undefined1 (*) [16])(*pauVar19 + lVar9 * 2));
              auVar5 = vmaxps_avx(auVar5,*(undefined1 (*) [16])(pauVar19[1] + lVar9 * 2));
              auVar5 = vmaxps_avx(auVar5,*(undefined1 (*) [16])(pauVar19[2] + lVar9 * 2));
              auVar1 = vmaxps_avx(auVar1,auVar5);
              *(undefined1 (*) [16])(*pauVar10 + lVar9) = auVar1;
              lVar16 = lVar16 + -0x20;
              iVar15 = iVar15 + -1;
              lVar17 = lVar9 + 0x10;
            } while (iVar15 != 0);
            pauVar10 = (undefined1 (*) [16])(pauVar10[1] + lVar9);
            pauVar14 = (undefined1 (*) [16])((long)pauVar14 - lVar16);
            pauVar18 = (undefined1 (*) [16])((long)pauVar18 - lVar16);
            pauVar19 = (undefined1 (*) [16])((long)pauVar19 - lVar16);
          }
          pauVar14 = (undefined1 (*) [16])(*pauVar14 + lVar12 * 4);
          pauVar18 = (undefined1 (*) [16])(*pauVar18 + lVar12 * 4);
          pauVar19 = (undefined1 (*) [16])(*pauVar19 + lVar12 * 4);
          iVar11 = iVar11 + 1;
        } while (iVar11 != iVar4);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != iVar2);
  }
  return;
}

Assistant:

static void pooling3x3s2_max_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = (w - 2 * outw + w) * 4;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        for (int i = 0; i < outh; i++)
        {
            int j = 0;
            for (; j + 1 < outw; j += 2)
            {
                __m128 _r00 = _mm_loadu_ps(r0);
                __m128 _r01 = _mm_loadu_ps(r0 + 4);
                __m128 _r02 = _mm_loadu_ps(r0 + 8);
                __m128 _r10 = _mm_loadu_ps(r1);
                __m128 _r11 = _mm_loadu_ps(r1 + 4);
                __m128 _r12 = _mm_loadu_ps(r1 + 8);
                __m128 _r20 = _mm_loadu_ps(r2);
                __m128 _r21 = _mm_loadu_ps(r2 + 4);
                __m128 _r22 = _mm_loadu_ps(r2 + 8);

                __m128 _max00 = _mm_max_ps(_r00, _r01);
                _max00 = _mm_max_ps(_max00, _r02);
                _max00 = _mm_max_ps(_max00, _r10);
                _max00 = _mm_max_ps(_max00, _r11);
                __m128 _max01 = _mm_max_ps(_r12, _r20);
                _max01 = _mm_max_ps(_max01, _r21);
                _max01 = _mm_max_ps(_max01, _r22);

                __m128 _r03 = _mm_loadu_ps(r0 + 12);
                __m128 _r04 = _mm_loadu_ps(r0 + 16);
                __m128 _r13 = _mm_loadu_ps(r1 + 12);
                __m128 _r14 = _mm_loadu_ps(r1 + 16);
                __m128 _r23 = _mm_loadu_ps(r2 + 12);
                __m128 _r24 = _mm_loadu_ps(r2 + 16);

                _mm_storeu_ps(outptr, _mm_max_ps(_max00, _max01));

                __m128 _max10 = _mm_max_ps(_r03, _r04);
                _max10 = _mm_max_ps(_max10, _r02);
                _max10 = _mm_max_ps(_max10, _r13);
                _max10 = _mm_max_ps(_max10, _r14);
                __m128 _max11 = _mm_max_ps(_r12, _r23);
                _max10 = _mm_max_ps(_max10, _r24);
                _max10 = _mm_max_ps(_max10, _r22);

                _mm_storeu_ps(outptr + 4, _mm_max_ps(_max10, _max11));

                r0 += 16;
                r1 += 16;
                r2 += 16;
                outptr += 8;
            }

            for (; j < outw; j++)
            {
                __m128 _r00 = _mm_loadu_ps(r0);
                __m128 _r01 = _mm_loadu_ps(r0 + 4);
                __m128 _r02 = _mm_loadu_ps(r0 + 8);
                __m128 _r10 = _mm_loadu_ps(r1);
                __m128 _r11 = _mm_loadu_ps(r1 + 4);
                __m128 _r12 = _mm_loadu_ps(r1 + 8);
                __m128 _r20 = _mm_loadu_ps(r2);
                __m128 _r21 = _mm_loadu_ps(r2 + 4);
                __m128 _r22 = _mm_loadu_ps(r2 + 8);

                __m128 _max0 = _mm_max_ps(_r00, _r01);
                _max0 = _mm_max_ps(_max0, _r02);
                _max0 = _mm_max_ps(_max0, _r10);
                _max0 = _mm_max_ps(_max0, _r11);
                __m128 _max1 = _mm_max_ps(_r12, _r20);
                _max1 = _mm_max_ps(_max1, _r21);
                _max1 = _mm_max_ps(_max1, _r22);

                _mm_storeu_ps(outptr, _mm_max_ps(_max0, _max1));

                r0 += 8;
                r1 += 8;
                r2 += 8;
                outptr += 4;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}